

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O1

void cconv_substruct_init(CTState *cts,CType *d,uint8_t *dp,TValue *o,MSize len,MSize *ip)

{
  CType *d_00;
  CTypeID1 CVar1;
  CType *pCVar2;
  uint uVar3;
  CTypeID1 CVar4;
  bool bVar5;
  
  CVar4 = d->sib;
  do {
    if (CVar4 == 0) {
      return;
    }
    pCVar2 = cts->tab;
    d_00 = pCVar2 + CVar4;
    CVar1 = pCVar2[CVar4].sib;
    if ((pCVar2[CVar4].info >> 0x1c) - 9 < 2) {
      if ((d_00->name).gcptr32 == 0) {
        uVar3 = 2;
LAB_00138522:
        bVar5 = false;
      }
      else {
        uVar3 = *ip;
        if (len <= uVar3) {
          uVar3 = 3;
          goto LAB_00138522;
        }
        *ip = uVar3 + 1;
        if ((d_00->info & 0xf0000000) == 0x90000000) {
          lj_cconv_ct_tv(cts,pCVar2 + (ushort)d_00->info,dp + d_00->size,o + uVar3,0);
        }
        else {
          lj_cconv_bf_tv(cts,d_00,dp + d_00->size,o + uVar3);
        }
        bVar5 = (d->info >> 0x17 & 1) == 0;
        uVar3 = (int)(d->info << 8) >> 0x1f & 3;
      }
      if (bVar5) goto LAB_00138559;
    }
    else {
      if ((pCVar2[CVar4].info & 0xf0ff0000) == 0x80030000) {
        cconv_substruct_init(cts,pCVar2 + (ushort)d_00->info,dp + d_00->size,o,len,ip);
        uVar3 = 3;
        if ((d->info & 0x800000) != 0) goto LAB_0013855b;
      }
LAB_00138559:
      uVar3 = 0;
    }
LAB_0013855b:
    CVar4 = CVar1;
    if (uVar3 == 3) {
      return;
    }
  } while( true );
}

Assistant:

static void cconv_substruct_init(CTState *cts, CType *d, uint8_t *dp,
				 TValue *o, MSize len, MSize *ip)
{
  CTypeID id = d->sib;
  while (id) {
    CType *df = ctype_get(cts, id);
    id = df->sib;
    if (ctype_isfield(df->info) || ctype_isbitfield(df->info)) {
      MSize i = *ip;
      if (!gcref(df->name)) continue;  /* Ignore unnamed fields. */
      if (i >= len) break;
      *ip = i + 1;
      if (ctype_isfield(df->info))
	lj_cconv_ct_tv(cts, ctype_rawchild(cts, df), dp+df->size, o + i, 0);
      else
	lj_cconv_bf_tv(cts, df, dp+df->size, o + i);
      if ((d->info & CTF_UNION)) break;
    } else if (ctype_isxattrib(df->info, CTA_SUBTYPE)) {
      cconv_substruct_init(cts, ctype_rawchild(cts, df),
			   dp+df->size, o, len, ip);
      if ((d->info & CTF_UNION)) break;
    }  /* Ignore all other entries in the chain. */
  }
}